

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_pwd.c
# Opt level: O2

err_t cmdPwdRead(cmd_pwd_t *pwd,char *cmdline)

{
  octet *buf;
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  u32 uVar4;
  size_t sVar5;
  cmd_pwd_t pcVar6;
  char **ppcVar7;
  ulong uVar8;
  octet *poVar9;
  size_t sVar10;
  err_t eVar11;
  size_t share_len;
  long lVar12;
  octet *pwd_00;
  char *pcVar13;
  long lVar14;
  int argc;
  ulong local_a8;
  char **argv;
  int local_94;
  octet *local_90;
  char **local_88;
  size_t epki_len_max;
  size_t local_78;
  octet *local_70;
  size_t epki_len;
  octet *local_60;
  size_t epki_len_min;
  octet *local_50;
  octet *local_48;
  size_t local_40;
  size_t local_38;
  
  bVar1 = strStartsWith(cmdline,"pass:");
  if (bVar1 == 0) {
    bVar1 = strStartsWith(cmdline,"env:");
    if (bVar1 == 0) {
      bVar1 = strStartsWith(cmdline,"share:");
      if (bVar1 == 0) {
        return 0x25b;
      }
      sVar5 = strLen("share:");
      argv = (char **)0x0;
      local_70 = (octet *)0x0;
      eVar2 = cmdArgCreate(&argc,&argv,cmdline + sVar5);
      if (eVar2 != 0) {
        return eVar2;
      }
      lVar12 = 0;
      local_88 = (char **)0x0;
      local_a8 = 0;
      local_94 = 0;
LAB_00105455:
      lVar14 = lVar12 * 8;
      lVar12 = lVar12 + 1;
      do {
        if ((argc == 0) || (bVar1 = strStartsWith(*(char **)((long)argv + lVar14),"-"), bVar1 == 0))
        {
          pwd_00 = local_70;
          eVar2 = 0x25b;
          if (local_70 == (octet *)0x0) {
            pwd_00 = (octet *)0x0;
            goto LAB_001056eb;
          }
          ppcVar7 = (char **)0x2;
          if (local_88 != (char **)0x0) {
            ppcVar7 = local_88;
          }
          if (((char **)(long)argc < ppcVar7) ||
             (eVar2 = cmdFileValExist(argc,(char **)((long)argv + lVar14)), eVar2 != 0))
          goto LAB_001056eb;
          sVar5 = (size_t)argc;
          *pwd = (cmd_pwd_t)0x0;
          local_88 = argv;
          if (local_a8 == 0) {
            local_78 = sVar5;
            sVar10 = cmdFileSize(*(char **)((long)argv + lVar14));
            epki_len = sVar10;
            if (sVar10 != 0xffffffffffffffff) {
              uVar8 = 0x10;
              goto LAB_001057a3;
            }
            eVar2 = 0xcf;
            goto LAB_001056eb;
          }
          share_len = local_a8 + 1;
          eVar2 = bpkiShareWrap((octet *)0x0,&epki_len_min,(octet *)0x0,share_len,(octet *)0x0,0,
                                (octet *)0x0,10000);
          if ((eVar2 != 0) ||
             (eVar2 = bpkiShareWrap((octet *)0x0,&epki_len_max,(octet *)0x0,share_len,(octet *)0x0,0
                                    ,(octet *)0x0,0xffffffffffffffff), eVar2 != 0))
          goto LAB_001056eb;
          goto LAB_0010584e;
        }
        bVar1 = strStartsWith(*(char **)((long)argv + lVar14),"-t");
        pcVar13 = *(char **)((long)argv + lVar14);
        if (bVar1 != 0) {
          sVar5 = strLen("-t");
          if (local_88 != (char **)0x0) {
LAB_001056d1:
            eVar2 = 0x25c;
            pwd_00 = local_70;
            goto LAB_001056eb;
          }
          pcVar13 = pcVar13 + sVar5;
          bVar1 = decIsValid(pcVar13);
          eVar2 = 0x25b;
          pwd_00 = local_70;
          if (((bVar1 == 0) || (sVar5 = decCLZ(pcVar13), pwd_00 = local_70, sVar5 != 0)) ||
             ((sVar5 = strLen(pcVar13), pwd_00 = local_70, 2 < sVar5 ||
              (uVar4 = decToU32(pcVar13), pwd_00 = local_70, uVar4 - 0x11 < 0xfffffff1))))
          goto LAB_001056eb;
          local_88 = (char **)(ulong)uVar4;
LAB_0010567b:
          argc = argc + -1;
          goto LAB_00105455;
        }
        bVar1 = strStartsWith(pcVar13,"-l");
        pcVar13 = *(char **)((long)argv + lVar14);
        if (bVar1 != 0) {
          sVar5 = strLen("-l");
          if (local_a8 != 0) goto LAB_001056d1;
          pcVar13 = pcVar13 + sVar5;
          bVar1 = decIsValid(pcVar13);
          eVar2 = 0x25b;
          pwd_00 = local_70;
          if (((((bVar1 != 0) && (sVar5 = decCLZ(pcVar13), pwd_00 = local_70, sVar5 == 0)) &&
               (sVar5 = strLen(pcVar13), pwd_00 = local_70, sVar5 == 3)) &&
              ((uVar4 = decToU32(pcVar13), pwd_00 = local_70, 0xffffff7e < uVar4 - 0x101 &&
               ((uVar4 & 0x3f) == 0)))) && (uVar4 != 0x80 || local_94 == 0)) {
            local_a8 = (ulong)(uVar4 >> 3);
            goto LAB_0010567b;
          }
          goto LAB_001056eb;
        }
        bVar1 = strStartsWith(pcVar13,"-crc");
        if (bVar1 != 0) goto LAB_0010553a;
        iVar3 = strCmp(*(char **)((long)argv + lVar14),"-pass");
        if (iVar3 != 0) {
          eVar2 = 0x25b;
          pwd_00 = local_70;
          goto LAB_001056eb;
        }
        if (local_70 != (octet *)0x0) goto LAB_001056d1;
        argc = argc + -1;
        eVar2 = cmdPwdRead((cmd_pwd_t *)&local_70,*(char **)((long)argv + lVar14 + 8));
        if (eVar2 != 0) goto LAB_001056f3;
        argc = argc + -1;
        lVar14 = lVar14 + 0x10;
        lVar12 = lVar12 + 2;
      } while( true );
    }
    sVar5 = strLen("env:");
    pcVar13 = getenv(cmdline + sVar5);
    bVar1 = strIsValid(pcVar13);
    if (pcVar13 == (char *)0x0) {
      return 0x69;
    }
    if (bVar1 == 0) {
      return 0x69;
    }
  }
  else {
    sVar5 = strLen("pass:");
    pcVar13 = cmdline + sVar5;
  }
  sVar5 = strLen(pcVar13);
  pcVar6 = cmdPwdCreate(sVar5);
  *pwd = pcVar6;
  if (pcVar6 != (cmd_pwd_t)0x0) {
    strCopy(pcVar6,pcVar13);
    return 0;
  }
  return 0x6e;
LAB_001057a3:
  if (0x20 < uVar8) goto LAB_0010583f;
  share_len = uVar8 + 1;
  local_a8 = uVar8;
  eVar2 = bpkiShareWrap((octet *)0x0,&epki_len_min,(octet *)0x0,share_len,(octet *)0x0,0,
                        (octet *)0x0,10000);
  if ((eVar2 != 0) ||
     (eVar2 = bpkiShareWrap((octet *)0x0,&epki_len_max,(octet *)0x0,share_len,(octet *)0x0,0,
                            (octet *)0x0,0xffffffffffffffff), eVar2 != 0)) goto LAB_001056eb;
  sVar5 = local_78;
  if (sVar10 <= epki_len_max && epki_len_min <= sVar10) goto LAB_0010584e;
  uVar8 = local_a8 + 8;
  goto LAB_001057a3;
LAB_0010583f:
  eVar2 = 0x132;
  goto LAB_001056eb;
LAB_0010553a:
  eVar2 = (local_94 != 0) + 0x25b;
  pwd_00 = local_70;
  if ((local_94 != 0) || (local_a8 == 0x10)) goto LAB_001056eb;
  argc = argc + -1;
  local_94 = 1;
  goto LAB_00105455;
LAB_0010584e:
  poVar9 = (octet *)blobCreate(epki_len_max + share_len + share_len * sVar5);
  if (poVar9 == (octet *)0x0) {
    poVar9 = (octet *)*pwd;
  }
  else {
    local_48 = poVar9 + share_len * sVar5;
    local_60 = local_48 + epki_len_max + 1;
    local_88 = (char **)((long)local_88 + lVar14);
    sVar10 = 0;
    local_90 = poVar9;
    local_50 = poVar9;
    while (ppcVar7 = local_88, sVar5 != sVar10) {
      local_78 = sVar10;
      eVar2 = cmdFileReadAll((void *)0x0,&epki_len,local_88[sVar10]);
      poVar9 = local_48;
      if ((((eVar2 != 0) || (eVar11 = 0x132, eVar2 = eVar11, epki_len < epki_len_min)) ||
          (epki_len_max < epki_len)) ||
         (eVar2 = cmdFileReadAll(local_48,&epki_len,ppcVar7[local_78]), eVar2 != 0))
      goto LAB_00105996;
      local_40 = epki_len;
      sVar10 = strLen((char *)pwd_00);
      eVar2 = bpkiShareUnwrap(local_50,&local_38,poVar9,local_40,pwd_00,sVar10);
      if ((eVar2 != 0) || (eVar2 = eVar11, local_38 != share_len)) goto LAB_00105996;
      local_50 = local_50 + share_len;
      sVar10 = local_78 + 1;
    }
    eVar2 = belsRecover2(local_60,sVar5,local_a8,local_90);
    buf = local_60;
    poVar9 = local_90;
    uVar8 = local_a8;
    if (eVar2 != 0) {
LAB_00105996:
      blobClose(local_90);
      goto LAB_001056eb;
    }
    if (local_94 != 0) {
      sVar5 = local_a8 - 8;
      beltMACStart(local_90,local_60,sVar5);
      beltMACStepA(buf,sVar5,poVar9);
      bVar1 = beltMACStepV(buf + (uVar8 - 8),poVar9);
      if (bVar1 == 0) {
        blobClose(local_90);
        eVar2 = 0x200;
        goto LAB_001056eb;
      }
    }
    pcVar6 = cmdPwdCreate(local_a8 * 2);
    *pwd = pcVar6;
    poVar9 = local_90;
    if (pcVar6 != (cmd_pwd_t)0x0) {
      hexFrom(pcVar6,local_60,local_a8);
      blobClose(local_90);
      eVar2 = 0;
      goto LAB_001056eb;
    }
  }
  blobClose(poVar9);
  eVar2 = 0x6e;
LAB_001056eb:
  blobClose(pwd_00);
LAB_001056f3:
  cmdArgClose(argv);
  return eVar2;
}

Assistant:

err_t cmdPwdRead(cmd_pwd_t* pwd, const char* cmdline)
{
	if (strStartsWith(cmdline, "pass:"))
		return cmdPwdReadPass(pwd, cmdline + strLen("pass:"));
	else if (strStartsWith(cmdline, "env:"))
		return cmdPwdReadEnv(pwd, cmdline + strLen("env:"));
	else if (strStartsWith(cmdline, "share:"))
		return cmdPwdReadShare(pwd, cmdline + strLen("share:"));
	return ERR_CMD_PARAMS;
}